

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O0

Node * __thiscall
Lexical::identifierProgram
          (Node *__return_storage_ptr__,Lexical *this,int *nowProcedure,int *checkTable,
          int *checkKind)

{
  int iVar1;
  reference pvVar2;
  bool bVar3;
  int local_50 [8];
  int *piStack_30;
  int beginIndex;
  int *checkKind_local;
  int *checkTable_local;
  int *nowProcedure_local;
  Lexical *this_local;
  
  piStack_30 = checkKind;
  checkKind_local = checkTable;
  checkTable_local = nowProcedure;
  nowProcedure_local = (int *)this;
  this_local = (Lexical *)__return_storage_ptr__;
  Generator::pushIndex(&this->generator);
  local_50[7] = this->wordIndex;
  iVar1 = this->wordIndex + 1;
  this->wordIndex = iVar1;
  pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[](&this->words,(long)iVar1);
  if (pvVar2->symbol != (this->parsing).identifierBase) {
    errorParsing(__return_storage_ptr__,this,local_50 + 7,this->wordIndex,0x19);
    return __return_storage_ptr__;
  }
  if (*checkKind_local == 1) {
    if (*piStack_30 == 1) {
      pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[]
                         (&this->words,(long)this->wordIndex);
      local_50[6] = 0;
      iVar1 = findDescription(this,&pvVar2->token,checkTable_local,local_50 + 6);
      bVar3 = false;
      if (iVar1 == -1) {
        pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[]
                           (&this->words,(long)this->wordIndex);
        local_50[5] = 1;
        iVar1 = findDescription(this,&pvVar2->token,checkTable_local,local_50 + 5);
        bVar3 = iVar1 == -1;
      }
      if (bVar3) {
        errorParsing(__return_storage_ptr__,this,local_50 + 7,this->wordIndex,0x1f);
        return __return_storage_ptr__;
      }
    }
    else {
      pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[]
                         (&this->words,(long)this->wordIndex);
      local_50[4] = 2;
      iVar1 = findDescription(this,&pvVar2->token,checkTable_local,local_50 + 4);
      if (iVar1 == -1) {
        errorParsing(__return_storage_ptr__,this,local_50 + 7,this->wordIndex,0x20);
        return __return_storage_ptr__;
      }
    }
  }
  else if (*checkKind_local == 2) {
    pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[]
                       (&this->words,(long)this->wordIndex);
    local_50[3] = 0;
    iVar1 = checkDescription(this,&pvVar2->token,checkTable_local,local_50 + 3);
    if (iVar1 != -1) {
      errorParsing(__return_storage_ptr__,this,local_50 + 7,this->wordIndex,0x21);
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[]
                       (&this->words,(long)this->wordIndex);
    local_50[2] = 1;
    iVar1 = checkDescription(this,&pvVar2->token,checkTable_local,local_50 + 2);
    if (iVar1 != -1) {
      errorParsing(__return_storage_ptr__,this,local_50 + 7,this->wordIndex,0x21);
      return __return_storage_ptr__;
    }
    pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[]
                       (&this->words,(long)this->wordIndex);
    local_50[1] = 2;
    iVar1 = checkDescription(this,&pvVar2->token,checkTable_local,local_50 + 1);
    if (iVar1 != -1) {
      errorParsing(__return_storage_ptr__,this,local_50 + 7,this->wordIndex,0x21);
      return __return_storage_ptr__;
    }
  }
  Generator::popIndex(&this->generator);
  pvVar2 = std::vector<Word,_std::allocator<Word>_>::operator[](&this->words,(long)this->wordIndex);
  local_50[0] = this->nodeCnt;
  this->nodeCnt = local_50[0] + 1;
  Node::Node(__return_storage_ptr__,&pvVar2->token,local_50,&this->wordIndex,&this->wordIndex);
  return __return_storage_ptr__;
}

Assistant:

Node identifierProgram(const int &nowProcedure, const int &checkTable=0, const int &checkKind=1) {
		generator.pushIndex();
		int beginIndex = wordIndex;

		if (words[++wordIndex].symbol == parsing.identifierBase) {
			if (checkTable == 1) {
				if (checkKind == 1) {
					if (findDescription(words[wordIndex].token, nowProcedure, 0) == -1 and
					    findDescription(words[wordIndex].token, nowProcedure, 1) == -1)
						return errorParsing(beginIndex, wordIndex, 31);
				} else {
					if (findDescription(words[wordIndex].token, nowProcedure, 2) == -1)
						return errorParsing(beginIndex, wordIndex, 32);
				}
			} else if (checkTable == 2) {
				if (checkDescription(words[wordIndex].token, nowProcedure, 0) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
				if (checkDescription(words[wordIndex].token, nowProcedure, 1) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
				if (checkDescription(words[wordIndex].token, nowProcedure, 2) != -1)
					return errorParsing(beginIndex, wordIndex, 33);
			}

			generator.popIndex();
			return Node(words[wordIndex].token, nodeCnt++, wordIndex, wordIndex);
		}
		return errorParsing(beginIndex, wordIndex, 25); // BASE ERROR
	}